

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean ad_big_enough(AD *ad,Pointer ar)

{
  bool bVar1;
  Pointer client_space;
  ulongi nbytes;
  
  balloc_after((AR *)ar,(Pointer)ad,&client_space,&nbytes);
  bVar1 = nbytes <= ad->nbytes;
  if (bVar1) {
    block_split(ad,nbytes,1);
    ad->client_space = client_space;
  }
  return (ulong)bVar1;
}

Assistant:

private Boolean ad_big_enough(ad, ar)
    AD        *ad;        /* the AD to test */
    Pointer    ar;        /* allocation request */
{
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    /* perform trial allocation to determine size */
    balloc_after((AR *)ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes <= ad->nbytes)
    {
        /* ad is big enough; split block if necessary */
        (void)block_split(ad, nbytes, MA_TRUE);

        /* set fields appropriately */
        ad->client_space = client_space;

        /* success */
        return MA_TRUE;
    }
    else
        /* ad is not big enough */
        return MA_FALSE;
}